

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiStyle::ImGuiStyle(ImGuiStyle *this)

{
  ImVec4 *local_308;
  ImVec4 local_300;
  ImVec4 local_2f0;
  ImVec4 local_2e0;
  ImVec4 local_2d0;
  ImVec4 local_2c0;
  ImVec4 local_2b0;
  ImVec4 local_2a0;
  ImVec4 local_290;
  ImVec4 local_280;
  ImVec4 local_270;
  ImVec4 local_260;
  ImVec4 local_250;
  ImVec4 local_240;
  ImVec4 local_230;
  ImVec4 local_220;
  ImVec4 local_210;
  ImVec4 local_200;
  ImVec4 local_1f0;
  ImVec4 local_1e0;
  ImVec4 local_1d0;
  ImVec4 local_1c0;
  ImVec4 local_1b0;
  ImVec4 local_1a0;
  ImVec4 local_190;
  ImVec4 local_180;
  ImVec4 local_170;
  ImVec4 local_160;
  ImVec4 local_150;
  ImVec4 local_140;
  ImVec4 local_130;
  ImVec4 local_120;
  ImVec4 local_110;
  ImVec4 local_100;
  ImVec4 local_f0;
  ImVec4 local_e0;
  ImVec4 local_d0;
  ImVec4 local_c0;
  ImVec4 local_b0;
  ImVec4 local_a0;
  ImVec4 local_90;
  ImVec4 local_80;
  ImVec4 local_70;
  ImVec4 local_60;
  ImVec2 local_50;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  ImVec2 local_30;
  ImVec2 local_28;
  ImVec2 local_20;
  ImVec2 local_18;
  ImGuiStyle *local_10;
  ImGuiStyle *this_local;
  
  local_10 = this;
  ImVec2::ImVec2(&this->WindowPadding);
  ImVec2::ImVec2(&this->WindowMinSize);
  ImVec2::ImVec2(&this->FramePadding);
  ImVec2::ImVec2(&this->ItemSpacing);
  ImVec2::ImVec2(&this->ItemInnerSpacing);
  ImVec2::ImVec2(&this->TouchExtraPadding);
  ImVec2::ImVec2(&this->DisplayWindowPadding);
  ImVec2::ImVec2(&this->DisplaySafeAreaPadding);
  local_308 = this->Colors;
  do {
    ImVec4::ImVec4(local_308);
    local_308 = local_308 + 1;
  } while ((ImGuiStyle *)local_308 != this + 1);
  this->Alpha = 1.0;
  ImVec2::ImVec2(&local_18,8.0,8.0);
  this->WindowPadding = local_18;
  ImVec2::ImVec2(&local_20,32.0,32.0);
  this->WindowMinSize = local_20;
  this->WindowRounding = 9.0;
  this->WindowTitleAlign = 1;
  this->ChildWindowRounding = 0.0;
  ImVec2::ImVec2(&local_28,4.0,3.0);
  this->FramePadding = local_28;
  this->FrameRounding = 0.0;
  ImVec2::ImVec2(&local_30,8.0,4.0);
  this->ItemSpacing = local_30;
  ImVec2::ImVec2(&local_38,4.0,4.0);
  this->ItemInnerSpacing = local_38;
  ImVec2::ImVec2(&local_40,0.0,0.0);
  this->TouchExtraPadding = local_40;
  this->IndentSpacing = 21.0;
  this->ColumnsMinSpacing = 6.0;
  this->ScrollbarSize = 16.0;
  this->ScrollbarRounding = 9.0;
  this->GrabMinSize = 10.0;
  this->GrabRounding = 0.0;
  ImVec2::ImVec2(&local_48,22.0,22.0);
  this->DisplayWindowPadding = local_48;
  ImVec2::ImVec2(&local_50,4.0,4.0);
  this->DisplaySafeAreaPadding = local_50;
  this->AntiAliasedLines = true;
  this->AntiAliasedShapes = true;
  this->CurveTessellationTol = 1.25;
  ImVec4::ImVec4(&local_60,0.9,0.9,0.9,1.0);
  this->Colors[0].x = local_60.x;
  this->Colors[0].y = local_60.y;
  this->Colors[0].z = local_60.z;
  this->Colors[0].w = local_60.w;
  ImVec4::ImVec4(&local_70,0.6,0.6,0.6,1.0);
  this->Colors[1].x = local_70.x;
  this->Colors[1].y = local_70.y;
  this->Colors[1].z = local_70.z;
  this->Colors[1].w = local_70.w;
  ImVec4::ImVec4(&local_80,0.0,0.0,0.0,0.7);
  this->Colors[2].x = local_80.x;
  this->Colors[2].y = local_80.y;
  this->Colors[2].z = local_80.z;
  this->Colors[2].w = local_80.w;
  ImVec4::ImVec4(&local_90,0.0,0.0,0.0,0.0);
  this->Colors[3].x = local_90.x;
  this->Colors[3].y = local_90.y;
  this->Colors[3].z = local_90.z;
  this->Colors[3].w = local_90.w;
  ImVec4::ImVec4(&local_a0,0.05,0.05,0.1,0.9);
  this->Colors[4].x = local_a0.x;
  this->Colors[4].y = local_a0.y;
  this->Colors[4].z = local_a0.z;
  this->Colors[4].w = local_a0.w;
  ImVec4::ImVec4(&local_b0,0.7,0.7,0.7,0.65);
  this->Colors[5].x = local_b0.x;
  this->Colors[5].y = local_b0.y;
  this->Colors[5].z = local_b0.z;
  this->Colors[5].w = local_b0.w;
  ImVec4::ImVec4(&local_c0,0.0,0.0,0.0,0.0);
  this->Colors[6].x = local_c0.x;
  this->Colors[6].y = local_c0.y;
  this->Colors[6].z = local_c0.z;
  this->Colors[6].w = local_c0.w;
  ImVec4::ImVec4(&local_d0,0.8,0.8,0.8,0.3);
  this->Colors[7].x = local_d0.x;
  this->Colors[7].y = local_d0.y;
  this->Colors[7].z = local_d0.z;
  this->Colors[7].w = local_d0.w;
  ImVec4::ImVec4(&local_e0,0.9,0.8,0.8,0.4);
  this->Colors[8].x = local_e0.x;
  this->Colors[8].y = local_e0.y;
  this->Colors[8].z = local_e0.z;
  this->Colors[8].w = local_e0.w;
  ImVec4::ImVec4(&local_f0,0.9,0.65,0.65,0.45);
  this->Colors[9].x = local_f0.x;
  this->Colors[9].y = local_f0.y;
  this->Colors[9].z = local_f0.z;
  this->Colors[9].w = local_f0.w;
  ImVec4::ImVec4(&local_100,0.27,0.27,0.54,0.83);
  this->Colors[10].x = local_100.x;
  this->Colors[10].y = local_100.y;
  this->Colors[10].z = local_100.z;
  this->Colors[10].w = local_100.w;
  ImVec4::ImVec4(&local_110,0.4,0.4,0.8,0.2);
  this->Colors[0xb].x = local_110.x;
  this->Colors[0xb].y = local_110.y;
  this->Colors[0xb].z = local_110.z;
  this->Colors[0xb].w = local_110.w;
  ImVec4::ImVec4(&local_120,0.32,0.32,0.63,0.87);
  this->Colors[0xc].x = local_120.x;
  this->Colors[0xc].y = local_120.y;
  this->Colors[0xc].z = local_120.z;
  this->Colors[0xc].w = local_120.w;
  ImVec4::ImVec4(&local_130,0.4,0.4,0.55,0.8);
  this->Colors[0xd].x = local_130.x;
  this->Colors[0xd].y = local_130.y;
  this->Colors[0xd].z = local_130.z;
  this->Colors[0xd].w = local_130.w;
  ImVec4::ImVec4(&local_140,0.2,0.25,0.3,0.6);
  this->Colors[0xe].x = local_140.x;
  this->Colors[0xe].y = local_140.y;
  this->Colors[0xe].z = local_140.z;
  this->Colors[0xe].w = local_140.w;
  ImVec4::ImVec4(&local_150,0.4,0.4,0.8,0.3);
  this->Colors[0xf].x = local_150.x;
  this->Colors[0xf].y = local_150.y;
  this->Colors[0xf].z = local_150.z;
  this->Colors[0xf].w = local_150.w;
  ImVec4::ImVec4(&local_160,0.4,0.4,0.8,0.4);
  this->Colors[0x10].x = local_160.x;
  this->Colors[0x10].y = local_160.y;
  this->Colors[0x10].z = local_160.z;
  this->Colors[0x10].w = local_160.w;
  ImVec4::ImVec4(&local_170,0.8,0.5,0.5,0.4);
  this->Colors[0x11].x = local_170.x;
  this->Colors[0x11].y = local_170.y;
  this->Colors[0x11].z = local_170.z;
  this->Colors[0x11].w = local_170.w;
  ImVec4::ImVec4(&local_180,0.2,0.2,0.2,0.99);
  this->Colors[0x12].x = local_180.x;
  this->Colors[0x12].y = local_180.y;
  this->Colors[0x12].z = local_180.z;
  this->Colors[0x12].w = local_180.w;
  ImVec4::ImVec4(&local_190,0.9,0.9,0.9,0.5);
  this->Colors[0x13].x = local_190.x;
  this->Colors[0x13].y = local_190.y;
  this->Colors[0x13].z = local_190.z;
  this->Colors[0x13].w = local_190.w;
  ImVec4::ImVec4(&local_1a0,1.0,1.0,1.0,0.3);
  this->Colors[0x14].x = local_1a0.x;
  this->Colors[0x14].y = local_1a0.y;
  this->Colors[0x14].z = local_1a0.z;
  this->Colors[0x14].w = local_1a0.w;
  ImVec4::ImVec4(&local_1b0,0.8,0.5,0.5,1.0);
  this->Colors[0x15].x = local_1b0.x;
  this->Colors[0x15].y = local_1b0.y;
  this->Colors[0x15].z = local_1b0.z;
  this->Colors[0x15].w = local_1b0.w;
  ImVec4::ImVec4(&local_1c0,0.67,0.4,0.4,0.6);
  this->Colors[0x16].x = local_1c0.x;
  this->Colors[0x16].y = local_1c0.y;
  this->Colors[0x16].z = local_1c0.z;
  this->Colors[0x16].w = local_1c0.w;
  ImVec4::ImVec4(&local_1d0,0.67,0.4,0.4,1.0);
  this->Colors[0x17].x = local_1d0.x;
  this->Colors[0x17].y = local_1d0.y;
  this->Colors[0x17].z = local_1d0.z;
  this->Colors[0x17].w = local_1d0.w;
  ImVec4::ImVec4(&local_1e0,0.8,0.5,0.5,1.0);
  this->Colors[0x18].x = local_1e0.x;
  this->Colors[0x18].y = local_1e0.y;
  this->Colors[0x18].z = local_1e0.z;
  this->Colors[0x18].w = local_1e0.w;
  ImVec4::ImVec4(&local_1f0,0.4,0.4,0.9,0.45);
  this->Colors[0x19].x = local_1f0.x;
  this->Colors[0x19].y = local_1f0.y;
  this->Colors[0x19].z = local_1f0.z;
  this->Colors[0x19].w = local_1f0.w;
  ImVec4::ImVec4(&local_200,0.45,0.45,0.9,0.8);
  this->Colors[0x1a].x = local_200.x;
  this->Colors[0x1a].y = local_200.y;
  this->Colors[0x1a].z = local_200.z;
  this->Colors[0x1a].w = local_200.w;
  ImVec4::ImVec4(&local_210,0.53,0.53,0.87,0.8);
  this->Colors[0x1b].x = local_210.x;
  this->Colors[0x1b].y = local_210.y;
  this->Colors[0x1b].z = local_210.z;
  this->Colors[0x1b].w = local_210.w;
  ImVec4::ImVec4(&local_220,0.5,0.5,0.5,1.0);
  this->Colors[0x1c].x = local_220.x;
  this->Colors[0x1c].y = local_220.y;
  this->Colors[0x1c].z = local_220.z;
  this->Colors[0x1c].w = local_220.w;
  ImVec4::ImVec4(&local_230,0.7,0.6,0.6,1.0);
  this->Colors[0x1d].x = local_230.x;
  this->Colors[0x1d].y = local_230.y;
  this->Colors[0x1d].z = local_230.z;
  this->Colors[0x1d].w = local_230.w;
  ImVec4::ImVec4(&local_240,0.9,0.7,0.7,1.0);
  this->Colors[0x1e].x = local_240.x;
  this->Colors[0x1e].y = local_240.y;
  this->Colors[0x1e].z = local_240.z;
  this->Colors[0x1e].w = local_240.w;
  ImVec4::ImVec4(&local_250,1.0,1.0,1.0,0.3);
  this->Colors[0x1f].x = local_250.x;
  this->Colors[0x1f].y = local_250.y;
  this->Colors[0x1f].z = local_250.z;
  this->Colors[0x1f].w = local_250.w;
  ImVec4::ImVec4(&local_260,1.0,1.0,1.0,0.6);
  this->Colors[0x20].x = local_260.x;
  this->Colors[0x20].y = local_260.y;
  this->Colors[0x20].z = local_260.z;
  this->Colors[0x20].w = local_260.w;
  ImVec4::ImVec4(&local_270,1.0,1.0,1.0,0.9);
  this->Colors[0x21].x = local_270.x;
  this->Colors[0x21].y = local_270.y;
  this->Colors[0x21].z = local_270.z;
  this->Colors[0x21].w = local_270.w;
  ImVec4::ImVec4(&local_280,0.5,0.5,0.9,0.5);
  this->Colors[0x22].x = local_280.x;
  this->Colors[0x22].y = local_280.y;
  this->Colors[0x22].z = local_280.z;
  this->Colors[0x22].w = local_280.w;
  ImVec4::ImVec4(&local_290,0.7,0.7,0.9,0.6);
  this->Colors[0x23].x = local_290.x;
  this->Colors[0x23].y = local_290.y;
  this->Colors[0x23].z = local_290.z;
  this->Colors[0x23].w = local_290.w;
  ImVec4::ImVec4(&local_2a0,0.7,0.7,0.7,1.0);
  this->Colors[0x24].x = local_2a0.x;
  this->Colors[0x24].y = local_2a0.y;
  this->Colors[0x24].z = local_2a0.z;
  this->Colors[0x24].w = local_2a0.w;
  ImVec4::ImVec4(&local_2b0,1.0,1.0,1.0,1.0);
  this->Colors[0x25].x = local_2b0.x;
  this->Colors[0x25].y = local_2b0.y;
  this->Colors[0x25].z = local_2b0.z;
  this->Colors[0x25].w = local_2b0.w;
  ImVec4::ImVec4(&local_2c0,0.9,0.7,0.0,1.0);
  this->Colors[0x26].x = local_2c0.x;
  this->Colors[0x26].y = local_2c0.y;
  this->Colors[0x26].z = local_2c0.z;
  this->Colors[0x26].w = local_2c0.w;
  ImVec4::ImVec4(&local_2d0,0.9,0.7,0.0,1.0);
  this->Colors[0x27].x = local_2d0.x;
  this->Colors[0x27].y = local_2d0.y;
  this->Colors[0x27].z = local_2d0.z;
  this->Colors[0x27].w = local_2d0.w;
  ImVec4::ImVec4(&local_2e0,1.0,0.6,0.0,1.0);
  this->Colors[0x28].x = local_2e0.x;
  this->Colors[0x28].y = local_2e0.y;
  this->Colors[0x28].z = local_2e0.z;
  this->Colors[0x28].w = local_2e0.w;
  ImVec4::ImVec4(&local_2f0,0.0,0.0,1.0,0.35);
  this->Colors[0x29].x = local_2f0.x;
  this->Colors[0x29].y = local_2f0.y;
  this->Colors[0x29].z = local_2f0.z;
  this->Colors[0x29].w = local_2f0.w;
  ImVec4::ImVec4(&local_300,0.2,0.2,0.2,0.35);
  this->Colors[0x2a].x = local_300.x;
  this->Colors[0x2a].y = local_300.y;
  this->Colors[0x2a].z = local_300.z;
  this->Colors[0x2a].w = local_300.w;
  return;
}

Assistant:

ImGuiStyle::ImGuiStyle()
{
    Alpha                   = 1.0f;             // Global alpha applies to everything in ImGui
    WindowPadding           = ImVec2(8,8);      // Padding within a window
    WindowMinSize           = ImVec2(32,32);    // Minimum window size
    WindowRounding          = 9.0f;             // Radius of window corners rounding. Set to 0.0f to have rectangular windows
    WindowTitleAlign        = ImGuiAlign_Left;  // Alignment for title bar text
    ChildWindowRounding     = 0.0f;             // Radius of child window corners rounding. Set to 0.0f to have rectangular child windows
    FramePadding            = ImVec2(4,3);      // Padding within a framed rectangle (used by most widgets)
    FrameRounding           = 0.0f;             // Radius of frame corners rounding. Set to 0.0f to have rectangular frames (used by most widgets).
    ItemSpacing             = ImVec2(8,4);      // Horizontal and vertical spacing between widgets/lines
    ItemInnerSpacing        = ImVec2(4,4);      // Horizontal and vertical spacing between within elements of a composed widget (e.g. a slider and its label)
    TouchExtraPadding       = ImVec2(0,0);      // Expand reactive bounding box for touch-based system where touch position is not accurate enough. Unfortunately we don't sort widgets so priority on overlap will always be given to the first widget. So don't grow this too much!
    IndentSpacing           = 21.0f;            // Horizontal spacing when e.g. entering a tree node. Generally == (FontSize + FramePadding.x*2).
    ColumnsMinSpacing       = 6.0f;             // Minimum horizontal spacing between two columns
    ScrollbarSize           = 16.0f;            // Width of the vertical scrollbar, Height of the horizontal scrollbar
    ScrollbarRounding       = 9.0f;             // Radius of grab corners rounding for scrollbar
    GrabMinSize             = 10.0f;            // Minimum width/height of a grab box for slider/scrollbar
    GrabRounding            = 0.0f;             // Radius of grabs corners rounding. Set to 0.0f to have rectangular slider grabs.
    DisplayWindowPadding    = ImVec2(22,22);    // Window positions are clamped to be visible within the display area by at least this amount. Only covers regular windows.
    DisplaySafeAreaPadding  = ImVec2(4,4);      // If you cannot see the edge of your screen (e.g. on a TV) increase the safe area padding. Covers popups/tooltips as well regular windows.
    AntiAliasedLines        = true;             // Enable anti-aliasing on lines/borders. Disable if you are really short on CPU/GPU.
    AntiAliasedShapes       = true;             // Enable anti-aliasing on filled shapes (rounded rectangles, circles, etc.)
    CurveTessellationTol    = 1.25f;            // Tessellation tolerance. Decrease for highly tessellated curves (higher quality, more polygons), increase to reduce quality.

    Colors[ImGuiCol_Text]                   = ImVec4(0.90f, 0.90f, 0.90f, 1.00f);
    Colors[ImGuiCol_TextDisabled]           = ImVec4(0.60f, 0.60f, 0.60f, 1.00f);
    Colors[ImGuiCol_WindowBg]               = ImVec4(0.00f, 0.00f, 0.00f, 0.70f);
    Colors[ImGuiCol_ChildWindowBg]          = ImVec4(0.00f, 0.00f, 0.00f, 0.00f);
    Colors[ImGuiCol_PopupBg]                = ImVec4(0.05f, 0.05f, 0.10f, 0.90f);
    Colors[ImGuiCol_Border]                 = ImVec4(0.70f, 0.70f, 0.70f, 0.65f);
    Colors[ImGuiCol_BorderShadow]           = ImVec4(0.00f, 0.00f, 0.00f, 0.00f);
    Colors[ImGuiCol_FrameBg]                = ImVec4(0.80f, 0.80f, 0.80f, 0.30f);   // Background of checkbox, radio button, plot, slider, text input
    Colors[ImGuiCol_FrameBgHovered]         = ImVec4(0.90f, 0.80f, 0.80f, 0.40f);
    Colors[ImGuiCol_FrameBgActive]          = ImVec4(0.90f, 0.65f, 0.65f, 0.45f);
    Colors[ImGuiCol_TitleBg]                = ImVec4(0.27f, 0.27f, 0.54f, 0.83f);
    Colors[ImGuiCol_TitleBgCollapsed]       = ImVec4(0.40f, 0.40f, 0.80f, 0.20f);
    Colors[ImGuiCol_TitleBgActive]          = ImVec4(0.32f, 0.32f, 0.63f, 0.87f);
    Colors[ImGuiCol_MenuBarBg]              = ImVec4(0.40f, 0.40f, 0.55f, 0.80f);
    Colors[ImGuiCol_ScrollbarBg]            = ImVec4(0.20f, 0.25f, 0.30f, 0.60f);
    Colors[ImGuiCol_ScrollbarGrab]          = ImVec4(0.40f, 0.40f, 0.80f, 0.30f);
    Colors[ImGuiCol_ScrollbarGrabHovered]   = ImVec4(0.40f, 0.40f, 0.80f, 0.40f);
    Colors[ImGuiCol_ScrollbarGrabActive]    = ImVec4(0.80f, 0.50f, 0.50f, 0.40f);
    Colors[ImGuiCol_ComboBg]                = ImVec4(0.20f, 0.20f, 0.20f, 0.99f);
    Colors[ImGuiCol_CheckMark]              = ImVec4(0.90f, 0.90f, 0.90f, 0.50f);
    Colors[ImGuiCol_SliderGrab]             = ImVec4(1.00f, 1.00f, 1.00f, 0.30f);
    Colors[ImGuiCol_SliderGrabActive]       = ImVec4(0.80f, 0.50f, 0.50f, 1.00f);
    Colors[ImGuiCol_Button]                 = ImVec4(0.67f, 0.40f, 0.40f, 0.60f);
    Colors[ImGuiCol_ButtonHovered]          = ImVec4(0.67f, 0.40f, 0.40f, 1.00f);
    Colors[ImGuiCol_ButtonActive]           = ImVec4(0.80f, 0.50f, 0.50f, 1.00f);
    Colors[ImGuiCol_Header]                 = ImVec4(0.40f, 0.40f, 0.90f, 0.45f);
    Colors[ImGuiCol_HeaderHovered]          = ImVec4(0.45f, 0.45f, 0.90f, 0.80f);
    Colors[ImGuiCol_HeaderActive]           = ImVec4(0.53f, 0.53f, 0.87f, 0.80f);
    Colors[ImGuiCol_Column]                 = ImVec4(0.50f, 0.50f, 0.50f, 1.00f);
    Colors[ImGuiCol_ColumnHovered]          = ImVec4(0.70f, 0.60f, 0.60f, 1.00f);
    Colors[ImGuiCol_ColumnActive]           = ImVec4(0.90f, 0.70f, 0.70f, 1.00f);
    Colors[ImGuiCol_ResizeGrip]             = ImVec4(1.00f, 1.00f, 1.00f, 0.30f);
    Colors[ImGuiCol_ResizeGripHovered]      = ImVec4(1.00f, 1.00f, 1.00f, 0.60f);
    Colors[ImGuiCol_ResizeGripActive]       = ImVec4(1.00f, 1.00f, 1.00f, 0.90f);
    Colors[ImGuiCol_CloseButton]            = ImVec4(0.50f, 0.50f, 0.90f, 0.50f);
    Colors[ImGuiCol_CloseButtonHovered]     = ImVec4(0.70f, 0.70f, 0.90f, 0.60f);
    Colors[ImGuiCol_CloseButtonActive]      = ImVec4(0.70f, 0.70f, 0.70f, 1.00f);
    Colors[ImGuiCol_PlotLines]              = ImVec4(1.00f, 1.00f, 1.00f, 1.00f);
    Colors[ImGuiCol_PlotLinesHovered]       = ImVec4(0.90f, 0.70f, 0.00f, 1.00f);
    Colors[ImGuiCol_PlotHistogram]          = ImVec4(0.90f, 0.70f, 0.00f, 1.00f);
    Colors[ImGuiCol_PlotHistogramHovered]   = ImVec4(1.00f, 0.60f, 0.00f, 1.00f);
    Colors[ImGuiCol_TextSelectedBg]         = ImVec4(0.00f, 0.00f, 1.00f, 0.35f);
    Colors[ImGuiCol_ModalWindowDarkening]   = ImVec4(0.20f, 0.20f, 0.20f, 0.35f);
}